

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O3

void __thiscall duckdb::MemoryStream::~MemoryStream(MemoryStream *this)

{
  (this->super_WriteStream)._vptr_WriteStream = (_func_int **)&PTR_WriteData_01967780;
  (this->super_ReadStream)._vptr_ReadStream = (_func_int **)&PTR_ReadData_019677b0;
  if (((this->allocator).ptr != (Allocator *)0x0) && (this->data != (data_ptr_t)0x0)) {
    optional_ptr<duckdb::Allocator,_true>::CheckValid(&this->allocator);
    Allocator::FreeData((this->allocator).ptr,this->data,this->capacity);
  }
  return;
}

Assistant:

MemoryStream::~MemoryStream() {
	if (allocator && data) {
		allocator->FreeData(data, capacity);
	}
}